

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::ReadCompressedInts<unsigned_int>
          (CrateReader *this,uint *out,size_t num_ints)

{
  ostringstream *poVar1;
  pointer *ppcVar2;
  StreamReader *pSVar3;
  uint64_t uVar4;
  bool bVar5;
  ostream *poVar6;
  size_t __new_size;
  ulong uVar7;
  size_t sVar8;
  unsigned_long *in_R8;
  size_t nbytes;
  size_t __n;
  uint64_t compSize;
  vector<char,_std::allocator<char>_> compBuffer;
  ostringstream ss_e;
  ulong local_200;
  string local_1f8;
  vector<char,_std::allocator<char>_> local_1d8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1b0._0_8_ = num_ints;
  if ((this->_config).maxInts < num_ints) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    ::std::__cxx11::ostringstream::ostringstream(poVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"ReadCompressedInts",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<(poVar1,0x12f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    ppcVar2 = &local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppcVar2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d8,"# of ints {} too large. maxInts is set to {}","");
    fmt::format<unsigned_long,unsigned_long>
              (&local_1f8,(fmt *)&local_1d8,(string *)local_1b0,&(this->_config).maxInts,in_R8);
    poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer *)
        local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != ppcVar2) {
      operator_delete(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (ulong)(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1));
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p == &local_1f8.field_2) goto LAB_001c9f06;
  }
  else {
    __new_size = Usd_IntegerCompression::GetCompressedBufferSize(num_ints);
    uVar7 = this->_memoryUsage + __new_size;
    this->_memoryUsage = uVar7;
    if (uVar7 <= (this->_config).maxMemoryBudget) {
      bVar5 = StreamReader::read8(this->_sr,&local_200);
      if (!bVar5) {
        return false;
      }
      if (__new_size < local_200) {
        local_200 = __new_size;
      }
      if (local_200 < 4) {
        return false;
      }
      if (this->_sr->length_ < local_200) {
        return false;
      }
      local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (char *)0x0;
      local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ::std::vector<char,_std::allocator<char>_>::resize(&local_1d8,__new_size);
      pSVar3 = this->_sr;
      uVar4 = pSVar3->idx_;
      __n = pSVar3->length_ - uVar4;
      if (uVar4 + local_200 <= pSVar3->length_) {
        __n = local_200;
      }
      if (__n - 1 < local_200) {
        memcpy(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,pSVar3->binary_ + uVar4,__n);
        pSVar3->idx_ = pSVar3->idx_ + __n;
        sVar8 = Usd_IntegerCompression::DecompressFromBuffer
                          (local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,local_200,out,num_ints,&this->_err,
                           (char *)0x0);
        bVar5 = sVar8 != 0;
        if (this->_memoryUsage < __new_size) {
          this->_memoryUsage = this->_memoryUsage - __new_size;
        }
      }
      else {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        ::std::__cxx11::ostringstream::ostringstream(poVar1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ReadCompressedInts",0x12);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<(poVar1,0x153);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Failed to read compressedInts.",0x1e);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        ::std::ios_base::~ios_base(local_138);
        bVar5 = false;
      }
      if (local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (char *)0x0) {
        operator_delete(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
        return bVar5;
      }
      return bVar5;
    }
    poVar1 = (ostringstream *)(local_1b0 + 8);
    ::std::__cxx11::ostringstream::ostringstream(poVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"ReadCompressedInts",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<(poVar1,0x139);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Reached to max memory budget.",0x1d);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p == &local_1f8.field_2) goto LAB_001c9f06;
  }
  operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
LAB_001c9f06:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool CrateReader::ReadCompressedInts(Int *out,
                                     size_t num_ints) {
  if (num_ints > _config.maxInts) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("# of ints {} too large. maxInts is set to {}", num_ints, _config.maxInts));
  }

  using Compressor =
      typename std::conditional<sizeof(Int) == 4, Usd_IntegerCompression,
                                Usd_IntegerCompression64>::type;


  // TODO: Read compressed data from _sr directly
  size_t compBufferSize = Compressor::GetCompressedBufferSize(num_ints);
  CHECK_MEMORY_USAGE(compBufferSize);

  uint64_t compSize;
  if (!_sr->read8(&compSize)) {
    return false;
  }

  if (compSize > compBufferSize) {
    // Truncate
    // TODO: return error?
    compSize = compBufferSize;
  }

  if (compSize > _sr->size()) {
    return false;
  }

  if (compSize < 4) {
    // Too small
    return false;
  }

  std::vector<char> compBuffer;
  compBuffer.resize(compBufferSize);
  if (!_sr->read(size_t(compSize), size_t(compSize),
                reinterpret_cast<uint8_t *>(compBuffer.data()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read compressedInts.");
  }

  bool ret = Compressor::DecompressFromBuffer(
      compBuffer.data(), size_t(compSize), out, num_ints, &_err);

  REDUCE_MEMORY_USAGE(compBufferSize);

  return ret;
}